

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O2

int __thiscall net::TcpSocket::Accept(TcpSocket *this,char *fromIP,UINT *fromPort)

{
  int iVar1;
  char *__src;
  socklen_t len;
  sockaddr_in from;
  
  if (fromIP != (char *)0x0) {
    from.sin_zero[0] = '\0';
    from.sin_zero[1] = '\0';
    from.sin_zero[2] = '\0';
    from.sin_zero[3] = '\0';
    from.sin_zero[4] = '\0';
    from.sin_zero[5] = '\0';
    from.sin_zero[6] = '\0';
    from.sin_zero[7] = '\0';
    from.sin_family = 2;
    from.sin_port = 0;
    from.sin_addr.s_addr = 0;
    len = 0x10;
    iVar1 = accept(this->fd_,(sockaddr *)&from,&len);
    if (-1 < iVar1) {
      __src = inet_ntoa((in_addr)from.sin_addr.s_addr);
      strcpy(fromIP,__src);
      *fromPort = (uint)(ushort)(from.sin_port << 8 | from.sin_port >> 8);
    }
    return iVar1;
  }
  __assert_fail("fromIP != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                ,0x2d,"int net::TcpSocket::Accept(char *, UINT &)");
}

Assistant:

int TcpSocket::Accept(char* fromIP, UINT& fromPort)
{
    assert(fromIP != NULL);
    sockaddr_in from;
    memset(&from, 0, sizeof(struct sockaddr_in));
    from.sin_family = AF_INET;
    socklen_t len = sizeof(from);
    int clientSock = -1;
    if ((clientSock = accept(fd_, (sockaddr*) &from, &len)) < 0 )
        return clientSock;
    strcpy(fromIP, inet_ntoa(from.sin_addr));
    fromPort = htons(from.sin_port);
    return clientSock;
}